

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O1

void outlet_anything(_outlet *x,t_symbol *s,int argc,t_atom *argv)

{
  _outconnect *p_Var1;
  
  if (stackcount < 999) {
    stackcount = stackcount + 1;
    for (p_Var1 = x->o_connections; p_Var1 != (_outconnect *)0x0; p_Var1 = p_Var1->oc_next) {
      pd_typedmess(p_Var1->oc_to,s,argc,argv);
    }
  }
  else {
    stackcount = stackcount + 1;
    pd_error(x->o_owner,"stack overflow");
  }
  stackcount = stackcount + -1;
  return;
}

Assistant:

void outlet_anything(t_outlet *x, t_symbol *s, int argc, t_atom *argv)
{
    t_outconnect *oc;
    if(++stackcount >= STACKITER)
        outlet_stackerror(x);
    else
    for (oc = x->o_connections; oc; oc = oc->oc_next)
        typedmess(oc->oc_to, s, argc, argv);
    --stackcount;
}